

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v6::internal::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  byte *pbVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  char *pcVar15;
  ulong unaff_R12;
  char *__s;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  char format [7];
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  char in_stack_ffffffffffffffa5;
  char cVar20;
  byte in_stack_ffffffffffffffa6;
  byte in_stack_ffffffffffffffa7;
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,
                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                   CONCAT14(in_stack_ffffffffffffffa4,
                                                            in_stack_ffffffffffffffa0)))),0,
                in_stack_ffffffffffffff98);
  }
  uVar16 = 5;
  if (-1 < precision) {
    uVar16 = precision - 1;
  }
  bVar13 = specs._4_1_;
  uVar17 = (ulong)uVar16;
  if (1 < bVar13) {
    uVar17 = (ulong)(uint)precision;
  }
  cVar20 = '%';
  if (bVar13 == 3 && (specs._4_4_ >> 0x15 & 1) != 0) {
    pbVar9 = &stack0xffffffffffffffa7;
    in_stack_ffffffffffffffa6 = 0x23;
  }
  else {
    pbVar9 = &stack0xffffffffffffffa6;
  }
  uVar16 = (uint)uVar17;
  if (-1 < (int)uVar16) {
    pbVar9[0] = 0x2e;
    pbVar9[1] = 0x2a;
    pbVar9 = pbVar9 + 2;
  }
  if (bVar13 == 3) {
    bVar10 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar10 = (bVar13 == 2) + 0x65;
  }
  *pbVar9 = bVar10;
  pbVar9[1] = 0;
  sVar3 = buf->size_;
  do {
    __s = buf->ptr_ + sVar3;
    uVar12 = buf->capacity_ - sVar3;
    if ((int)uVar17 < 0) {
      uVar8 = snprintf(__s,uVar12,&stack0xffffffffffffffa5,value);
    }
    else {
      uVar8 = snprintf(__s,uVar12,&stack0xffffffffffffffa5,value,uVar17);
    }
    uVar18 = (ulong)uVar8;
    if ((int)uVar8 < 0) {
      bVar5 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_buffer)(buf,buf->capacity_ + 1);
      }
    }
    else {
      if (uVar18 < uVar12) {
        if (bVar13 == 2) {
          if (uVar16 != 0) {
            unaff_R12 = 1;
            do {
              lVar6 = unaff_R12 + (uVar18 - 2);
              unaff_R12 = unaff_R12 - 1;
            } while ((byte)(__s[lVar6] - 0x30U) < 10);
            uVar17 = (ulong)uVar16;
            if (0 < (int)unaff_R12) {
LAB_00143a61:
              assert_fail((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                           CONCAT16(in_stack_ffffffffffffffa6,
                                                    CONCAT15(cVar20,CONCAT14(
                                                  in_stack_ffffffffffffffa4,uVar16)))),0,
                          in_stack_ffffffffffffff98);
            }
            memmove(__s + unaff_R12 + uVar18 + -1,__s + unaff_R12 + uVar18,
                    (ulong)(-(int)unaff_R12 & 0x7fffffff));
            uVar12 = (ulong)(uVar8 - 1);
            if (buf->capacity_ < uVar12) {
              (**buf->_vptr_buffer)(buf,uVar12);
            }
            buf->size_ = uVar12;
            bVar5 = false;
            goto LAB_00143a27;
          }
        }
        else {
          if (bVar13 != 3) {
            uVar17 = 1;
            lVar6 = uVar18 - 2;
            lVar7 = 1;
            pcVar1 = __s;
            do {
              pcVar15 = pcVar1;
              lVar11 = lVar7;
              lVar19 = lVar6;
              uVar17 = uVar17 + 1;
              lVar6 = lVar19 + -1;
              lVar7 = lVar11 + -1;
              pcVar1 = pcVar15 + -1;
            } while (pcVar15[uVar18 - 1] != 'e');
            cVar2 = pcVar15[uVar18];
            if ((cVar2 != '+') && (cVar2 != '-')) {
              __assert_fail("sign == \'+\' || sign == \'-\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/spdlog/fmt/bundled/format-inl.h"
                            ,0x4ab,
                            "int fmt::internal::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                           );
            }
            iVar14 = 0;
            do {
              if (9 < (byte)(__s[lVar11 + uVar18] - 0x30U)) {
                __assert_fail("is_digit(*p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/spdlog/fmt/bundled/format-inl.h"
                              ,0x4af,
                              "int fmt::internal::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                             );
              }
              iVar14 = (uint)(byte)__s[lVar11 + uVar18] + iVar14 * 10 + -0x30;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0);
            iVar4 = -iVar14;
            if (cVar2 != '-') {
              iVar4 = iVar14;
            }
            uVar8 = 0;
            if (uVar18 != uVar17) {
              do {
                pcVar1 = __s + lVar19;
                lVar19 = lVar19 + -1;
              } while (*pcVar1 == '0');
              uVar8 = (uint)lVar19;
              if ((int)uVar8 < 0) goto LAB_00143a61;
              memmove(__s + 1,__s + 2,(ulong)(uVar8 & 0x7fffffff));
            }
            uVar17 = (ulong)uVar8 + sVar3 + 1;
            if (buf->capacity_ < uVar17) {
              (**buf->_vptr_buffer)(buf,uVar17);
            }
            buf->size_ = uVar17;
            unaff_R12 = (ulong)(iVar4 - uVar8);
            bVar5 = false;
            goto LAB_00143a22;
          }
          uVar18 = uVar18 + sVar3;
        }
        if (buf->capacity_ < uVar18) {
          (**buf->_vptr_buffer)(buf,uVar18);
        }
        buf->size_ = uVar18;
        bVar5 = false;
        unaff_R12 = 0;
      }
      else {
        uVar18 = uVar18 + sVar3 + 1;
        bVar5 = true;
        if (buf->capacity_ < uVar18) {
          (**buf->_vptr_buffer)(buf,uVar18);
        }
      }
LAB_00143a22:
      uVar17 = (ulong)uVar16;
    }
LAB_00143a27:
    if (!bVar5) {
      return (int)unaff_R12;
    }
  } while( true );
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto becase of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}